

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O2

int msg_write(int fd,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  ulong uStack_30;
  
  uStack_30 = 0;
  do {
    sVar1 = write(fd,(void *)((long)buf + uStack_30),count - uStack_30);
    if (sVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0xb) goto LAB_0010ef38;
      usleep(50000);
    }
    else {
      if (sVar1 == 0) {
        perror("write");
        uStack_30 = 0xffffffffffffffff;
        break;
      }
LAB_0010ef38:
      uStack_30 = uStack_30 + sVar1;
    }
  } while (uStack_30 < count);
  return (int)uStack_30;
}

Assistant:

static int msg_write(int fd, void *buf, size_t count)
{
    ssize_t bytes;
    size_t total = 0;

    do {
#ifdef _WIN32
        bytes = send(fd, (uint8_t *)buf + total, count - total, 0);
#else
        bytes = write(fd, (uint8_t *)buf + total, count - total);
#endif
        if (bytes == -1) {
            if (errno == EAGAIN) {
                /*
                 * This could happen, since this function goal is not to
                 * return until all data have been read, just sleep a little
                 * bit (0.05 seconds)
                 */

#ifdef _WIN32
                Sleep(5);
#else
                usleep(50000);
#endif
                continue;
            }
        }
        else if (bytes == 0) {
            /* Broken pipe ? */
            perror("write");
            return -1;
        }
        total += bytes;

    } while (total < count);

    return total;
}